

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O3

Result __thiscall
wabt::anon_unknown_15::BinaryReaderIR::OnDataSymbol
          (BinaryReaderIR *this,Index index,uint32_t flags,string_view name,Index segment,
          uint32_t offset,uint32_t size)

{
  Module *pMVar1;
  pointer ppDVar2;
  DataSegment *pDVar3;
  Enum EVar4;
  string_view name_00;
  string local_78;
  string local_58;
  Index local_38;
  
  name_00._M_str = (string *)name._M_len;
  EVar4 = Ok;
  if ((name_00._M_str != (string *)0x0) && (EVar4 = Ok, (flags & 0x10) == 0 && offset == 0)) {
    pMVar1 = this->module_;
    ppDVar2 = (pMVar1->data_segments).
              super__Vector_base<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((ulong)segment <
        (ulong)((long)(pMVar1->data_segments).
                      super__Vector_base<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish - (long)ppDVar2 >> 3)) {
      pDVar3 = ppDVar2[segment];
      name_00._M_len = (size_t)name._M_str;
      (anonymous_namespace)::MakeDollarName_abi_cxx11_
                (&local_58,(_anonymous_namespace_ *)name_00._M_str,name_00);
      GetUniqueName(&local_78,(BinaryReaderIR *)&pMVar1->data_segment_bindings,
                    (BindingHash *)&local_58,name_00._M_str);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,
                        CONCAT44(local_58.field_2._M_allocated_capacity._4_4_,
                                 local_58.field_2._M_allocated_capacity._0_4_) + 1);
      }
      std::__cxx11::string::_M_assign((string *)&pDVar3->name);
      local_58.field_2._M_allocated_capacity._0_4_ = 0;
      local_58.field_2._M_allocated_capacity._4_4_ = 0;
      local_58.field_2._8_4_ = 0;
      local_58._M_dataplus._M_p = (pointer)0x0;
      local_58._M_string_length._0_4_ = 0;
      local_58._M_string_length._4_4_ = 0;
      EVar4 = Ok;
      local_38 = segment;
      std::
      _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,wabt::Binding>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
      ::_M_emplace<std::__cxx11::string&,wabt::Binding>
                ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,wabt::Binding>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
                  *)&this->module_->data_segment_bindings,0,&local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      PrintError(this,"invalid data segment index: %u",(ulong)segment);
      EVar4 = Error;
    }
  }
  return (Result)EVar4;
}

Assistant:

Result BinaryReaderIR::OnDataSymbol(Index index,
                                    uint32_t flags,
                                    std::string_view name,
                                    Index segment,
                                    uint32_t offset,
                                    uint32_t size) {
  if (name.empty()) {
    return Result::Ok;
  }
  if (flags & WABT_SYMBOL_FLAG_UNDEFINED) {
    // Refers to data in another file, `segment` not valid.
    return Result::Ok;
  }
  if (offset) {
    // If it is pointing into the data segment, then it's not really naming
    // the whole segment.
    return Result::Ok;
  }
  if (segment >= module_->data_segments.size()) {
    PrintError("invalid data segment index: %" PRIindex, segment);
    return Result::Error;
  }
  DataSegment* seg = module_->data_segments[segment];
  std::string dollar_name =
      GetUniqueName(&module_->data_segment_bindings, MakeDollarName(name));
  seg->name = dollar_name;
  module_->data_segment_bindings.emplace(dollar_name, Binding(segment));
  return Result::Ok;
}